

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnitTest.cpp
# Opt level: O2

void initNames(void)

{
  uint32_t uVar1;
  uint32_t uVar2;
  int j;
  ulong uVar3;
  int i;
  long lVar4;
  
  for (lVar4 = 0; lVar4 != 100000; lVar4 = lVar4 + 1) {
    uVar1 = rand32();
    std::__cxx11::basic_string<char,_std::char_traits<char>,_guts::Allocator<char>_>::resize
              (names_abi_cxx11_ + lVar4,(ulong)(uVar1 & 0x1f));
    for (uVar3 = 0; (uVar1 & 0x1f) != uVar3; uVar3 = uVar3 + 1) {
      uVar2 = rand32();
      names_abi_cxx11_[lVar4]._M_dataplus._M_p[uVar3] = (char)((ulong)uVar2 % 0x1a) + 'A';
    }
  }
  return;
}

Assistant:

void initNames()
{
    for (int i = 0; i != INT_RANGE; ++i)
    {
        int length = rand32() % 32;
        names[i].resize(length);
        for (int j = 0; j != length; ++j)
        {
            names[i][j] = 'A' + (rand32() % 26);
        }
    }
}